

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O0

btScalar __thiscall btCollisionShape::getAngularMotionDisc(btCollisionShape *this)

{
  long *in_RDI;
  btScalar bVar1;
  btScalar disc;
  btVector3 center;
  float local_1c;
  btVector3 local_18;
  
  btVector3::btVector3(&local_18);
  (**(code **)(*in_RDI + 0x18))(in_RDI,&local_18,&local_1c);
  bVar1 = btVector3::length((btVector3 *)0x1ababa);
  return bVar1 + local_1c;
}

Assistant:

btScalar	btCollisionShape::getAngularMotionDisc() const
{
	///@todo cache this value, to improve performance
	btVector3	center;
	btScalar disc;
	getBoundingSphere(center,disc);
	disc += (center).length();
	return disc;
}